

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

void __thiscall rengine::OpenGLRenderer::renderToLayer(OpenGLRenderer *this,Element *e)

{
  byte bVar1;
  byte bVar2;
  GLuint GVar3;
  mat4 o;
  mat4 o_00;
  mat4 o_01;
  mat4 o_02;
  mat4 o_03;
  mat4 o_04;
  GLuint GVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  void *pvVar8;
  char *o_05;
  float fVar9;
  float fVar10;
  vec4 local_508;
  vec2 local_4f8;
  vec2 local_4f0;
  vec2 local_4e8;
  vec2 local_4e0;
  vec2 local_4d8;
  vec2 local_4d0;
  mat4 local_4c8;
  mat4 local_480;
  mat4 local_438;
  mat4 local_3f4;
  mat4 local_3b0;
  mat4 local_36c;
  mat4 local_328;
  undefined1 local_2e4 [8];
  rect2d expandedWidth;
  int tmpTex;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  uint local_290;
  mat4 local_288;
  mat4 local_240;
  mat4 local_1f8;
  mat4 local_1b4;
  mat4 local_170;
  mat4 local_12c;
  vec2 local_e8;
  vec2 vStack_e0;
  string local_c8 [32];
  vec2 local_a8;
  vec2 local_a0;
  vec2 local_98;
  ShadowNode *local_90;
  ShadowNode *shadowNode;
  BlurNode *blurNode;
  vec2 storedSize;
  mat4 storedProjection;
  GLuint storedFbo;
  bool storedTextureed;
  float fStack_24;
  bool stored3d;
  rect2d devRect;
  Element *e_local;
  OpenGLRenderer *this_local;
  
  devRect.br = (vec2)e;
  if ((*(uint *)&e->field_0x18 >> 0x1e & 1) == 0) {
    __assert_fail("e->layered",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                  ,0x2cf,"void rengine::OpenGLRenderer::renderToLayer(Element *)");
  }
  _storedFbo = boundingRectFor(this,e->vboOffset);
  fVar9 = rect2d::width((rect2d *)&storedFbo);
  if ((0.0 < fVar9) && (fVar9 = rect2d::height((rect2d *)&storedFbo), 0.0 < fVar9)) {
    bVar1 = this->field_0x1f8;
    bVar2 = this->field_0x1f8;
    GVar3 = this->m_fbo;
    memcpy(&storedSize,&this->m_proj,0x44);
    unique0x00012000 = this->m_surfaceSize;
    this->field_0x1f8 =
         this->field_0x1f8 & 0xfe |
         ((this->field_0x1f8 & 1) != 0 || (*(uint *)((long)devRect.br + 0x18) >> 0x1d & 1) != 0);
    this->field_0x1f8 = this->field_0x1f8 & 0xfd | 2;
    shadowNode = (ShadowNode *)BlurNode::from(*(Node **)devRect.br);
    local_90 = ShadowNode::from(*(Node **)devRect.br);
    if ((shadowNode != (ShadowNode *)0x0) || (local_90 != (ShadowNode *)0x0)) {
      vec2::vec2(&local_98,1.0);
      vec2::operator-=((vec2 *)&storedFbo,local_98);
      vec2::vec2(&local_a0,1.0);
      vec2::operator+=(&devRect.tl,local_a0);
    }
    local_a8 = rect2d::size((rect2d *)&storedFbo);
    this->m_surfaceSize = local_a8;
    GVar4 = TexturePool::acquire(&this->m_texturePool);
    *(GLuint *)((long)devRect.br + 0x10) = GVar4;
    iVar5 = *(int *)((long)devRect.br + 0x10);
    fVar9 = rect2d::width((rect2d *)&storedFbo);
    fVar10 = rect2d::height((rect2d *)&storedFbo);
    rengine_create_texture(iVar5,(int)fVar9,(int)fVar10);
    glGenFramebuffers(1,&this->m_fbo);
    glBindFramebuffer(0x8d40,this->m_fbo);
    glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,*(undefined4 *)((long)devRect.br + 0x10),0);
    iVar5 = glCheckFramebufferStatus(0x8d40);
    if (iVar5 != 0x8cd5) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"W [");
      log_timestring_abi_cxx11_();
      poVar7 = std::operator<<(poVar7,local_c8);
      poVar7 = std::operator<<(poVar7,"]: ");
      poVar7 = std::operator<<(poVar7,"void rengine::OpenGLRenderer::renderToLayer(Element *)");
      poVar7 = std::operator<<(poVar7,": ");
      o_05 = "FBO failed, devRect=";
      poVar7 = std::operator<<(poVar7,"FBO failed, devRect=");
      local_e8 = _storedFbo;
      vStack_e0 = devRect.tl;
      poVar7 = operator<<((rengine *)poVar7,(ostream *)o_05,_storedFbo);
      poVar7 = std::operator<<(poVar7,", dim=");
      fVar9 = rect2d::width((rect2d *)&storedFbo);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,fVar9);
      poVar7 = std::operator<<(poVar7,"x");
      fVar9 = rect2d::height((rect2d *)&storedFbo);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,fVar9);
      poVar7 = std::operator<<(poVar7,", tex=");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(uint *)((long)devRect.br + 0x10));
      poVar7 = std::operator<<(poVar7,", fbo=");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->m_fbo);
      poVar7 = std::operator<<(poVar7,", error=");
      pvVar8 = (void *)std::ostream::operator<<(poVar7,std::hex);
      uVar6 = glCheckFramebufferStatus(0x8d40);
      pvVar8 = (void *)std::ostream::operator<<(pvVar8,uVar6);
      std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_c8);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/openglrenderer.h"
                    ,0x2fd,"void rengine::OpenGLRenderer::renderToLayer(Element *)");
    }
    mat4::scale2D(&local_1f8,1.0,-1.0);
    mat4::translate2D(&local_240,-1.0,1.0);
    o.m[2] = local_240.m[2];
    o.m[3] = local_240.m[3];
    o.m[0] = local_240.m[0];
    o.m[1] = local_240.m[1];
    o.m[4] = local_240.m[4];
    o.m[5] = local_240.m[5];
    o.m[6] = local_240.m[6];
    o.m[7] = local_240.m[7];
    o.m[8] = local_240.m[8];
    o.m[9] = local_240.m[9];
    o.m[10] = local_240.m[10];
    o.m[0xb] = local_240.m[0xb];
    o.m[0xc] = local_240.m[0xc];
    o.m[0xd] = local_240.m[0xd];
    o.m[0xe] = local_240.m[0xe];
    o.m[0xf] = local_240.m[0xf];
    o.type = local_240.type;
    mat4::operator*(&local_1b4,&local_1f8,o);
    fVar9 = rect2d::width((rect2d *)&storedFbo);
    fVar10 = rect2d::height((rect2d *)&storedFbo);
    mat4::scale2D(&local_288,2.0 / fVar9,-2.0 / fVar10);
    o_00.m[2] = local_288.m[2];
    o_00.m[3] = local_288.m[3];
    o_00.m[0] = local_288.m[0];
    o_00.m[1] = local_288.m[1];
    o_00.m[4] = local_288.m[4];
    o_00.m[5] = local_288.m[5];
    o_00.m[6] = local_288.m[6];
    o_00.m[7] = local_288.m[7];
    o_00.m[8] = local_288.m[8];
    o_00.m[9] = local_288.m[9];
    o_00.m[10] = local_288.m[10];
    o_00.m[0xb] = local_288.m[0xb];
    o_00.m[0xc] = local_288.m[0xc];
    o_00.m[0xd] = local_288.m[0xd];
    o_00.m[0xe] = local_288.m[0xe];
    o_00.m[0xf] = local_288.m[0xf];
    o_00.type = local_288.type;
    mat4::operator*(&local_170,&local_1b4,o_00);
    mat4::translate2D((mat4 *)&expandedWidth.br.y,-(float)storedFbo,-fStack_24);
    o_01.m._8_8_ = uStack_2c8;
    o_01.m[0] = expandedWidth.br.y;
    o_01.m[1] = (float)tmpTex;
    o_01.m._16_8_ = local_2c0;
    o_01.m._24_8_ = uStack_2b8;
    o_01.m._32_8_ = local_2b0;
    o_01.m._40_8_ = uStack_2a8;
    o_01.m._48_8_ = local_2a0;
    o_01.m._56_8_ = uStack_298;
    o_01.type = local_290;
    mat4::operator*(&local_12c,&local_170,o_01);
    memcpy(&this->m_proj,&local_12c,0x44);
    this->m_matrixState = 0xffffffff;
    glClearColor();
    glClear(0x4000);
    render(this,(Element *)((long)devRect.br + 0x20),
           (Element *)
           ((long)devRect.br + (long)(int)(*(uint *)((long)devRect.br + 0x18) & 0x1fffffff) * 0x20 +
           0x20));
    if ((shadowNode != (ShadowNode *)0x0) || (local_90 != (ShadowNode *)0x0)) {
      expandedWidth.br.x = *(float *)((long)devRect.br + 0x10);
      GVar4 = TexturePool::acquire(&this->m_texturePool);
      *(GLuint *)((long)devRect.br + 0x10) = GVar4;
      _local_2e4 = boundingRectFor(this,*(int *)((long)devRect.br + 8) + 4);
      mat4::scale2D(&local_3f4,1.0,-1.0);
      mat4::translate2D(&local_438,-1.0,1.0);
      o_02.m[2] = local_438.m[2];
      o_02.m[3] = local_438.m[3];
      o_02.m[0] = local_438.m[0];
      o_02.m[1] = local_438.m[1];
      o_02.m[4] = local_438.m[4];
      o_02.m[5] = local_438.m[5];
      o_02.m[6] = local_438.m[6];
      o_02.m[7] = local_438.m[7];
      o_02.m[8] = local_438.m[8];
      o_02.m[9] = local_438.m[9];
      o_02.m[10] = local_438.m[10];
      o_02.m[0xb] = local_438.m[0xb];
      o_02.m[0xc] = local_438.m[0xc];
      o_02.m[0xd] = local_438.m[0xd];
      o_02.m[0xe] = local_438.m[0xe];
      o_02.m[0xf] = local_438.m[0xf];
      o_02.type = local_438.type;
      mat4::operator*(&local_3b0,&local_3f4,o_02);
      fVar9 = rect2d::width((rect2d *)local_2e4);
      fVar10 = rect2d::height((rect2d *)local_2e4);
      mat4::scale2D(&local_480,2.0 / fVar9,-2.0 / fVar10);
      o_03.m[2] = local_480.m[2];
      o_03.m[3] = local_480.m[3];
      o_03.m[0] = local_480.m[0];
      o_03.m[1] = local_480.m[1];
      o_03.m[4] = local_480.m[4];
      o_03.m[5] = local_480.m[5];
      o_03.m[6] = local_480.m[6];
      o_03.m[7] = local_480.m[7];
      o_03.m[8] = local_480.m[8];
      o_03.m[9] = local_480.m[9];
      o_03.m[10] = local_480.m[10];
      o_03.m[0xb] = local_480.m[0xb];
      o_03.m[0xc] = local_480.m[0xc];
      o_03.m[0xd] = local_480.m[0xd];
      o_03.m[0xe] = local_480.m[0xe];
      o_03.m[0xf] = local_480.m[0xf];
      o_03.type = local_480.type;
      mat4::operator*(&local_36c,&local_3b0,o_03);
      mat4::translate2D(&local_4c8,-(float)local_2e4._0_4_,-(float)local_2e4._4_4_);
      o_04.m[2] = local_4c8.m[2];
      o_04.m[3] = local_4c8.m[3];
      o_04.m[0] = local_4c8.m[0];
      o_04.m[1] = local_4c8.m[1];
      o_04.m[4] = local_4c8.m[4];
      o_04.m[5] = local_4c8.m[5];
      o_04.m[6] = local_4c8.m[6];
      o_04.m[7] = local_4c8.m[7];
      o_04.m[8] = local_4c8.m[8];
      o_04.m[9] = local_4c8.m[9];
      o_04.m[10] = local_4c8.m[10];
      o_04.m[0xb] = local_4c8.m[0xb];
      o_04.m[0xc] = local_4c8.m[0xc];
      o_04.m[0xd] = local_4c8.m[0xd];
      o_04.m[0xe] = local_4c8.m[0xe];
      o_04.m[0xf] = local_4c8.m[0xf];
      o_04.type = local_4c8.type;
      mat4::operator*(&local_328,&local_36c,o_04);
      memcpy(&this->m_proj,&local_328,0x44);
      this->m_matrixState = 0xffffffff;
      iVar5 = *(int *)((long)devRect.br + 0x10);
      fVar9 = rect2d::width((rect2d *)local_2e4);
      fVar10 = rect2d::height((rect2d *)local_2e4);
      rengine_create_texture(iVar5,(int)fVar9,(int)fVar10);
      glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,*(undefined4 *)((long)devRect.br + 0x10),0);
      glClear(0x4000);
      fVar9 = rect2d::width((rect2d *)local_2e4);
      fVar10 = rect2d::height((rect2d *)local_2e4);
      glViewport(0,0,(int)fVar9,(int)fVar10);
      fVar9 = expandedWidth.br.x;
      if (shadowNode == (ShadowNode *)0x0) {
        if (local_90 != (ShadowNode *)0x0) {
          iVar5 = *(int *)((long)devRect.br + 8);
          uVar6 = ShadowNode::radius(local_90);
          local_4e8 = rect2d::size((rect2d *)local_2e4);
          local_4f0 = rect2d::size((rect2d *)&storedFbo);
          fVar10 = rect2d::width((rect2d *)local_2e4);
          vec2::vec2(&local_4f8,1.0 / fVar10,0.0);
          vec4::vec4(&local_508,0.0,0.0,0.0,1.0);
          drawShadowQuad(this,iVar5 + 4,(GLuint)fVar9,uVar6,local_4e8,local_4f0,local_4f8,local_508)
          ;
          *(float *)((long)devRect.br + 0x14) = expandedWidth.br.x;
        }
      }
      else {
        iVar5 = *(int *)((long)devRect.br + 8);
        uVar6 = BlurNode::radius((BlurNode *)shadowNode);
        local_4d0 = rect2d::size((rect2d *)local_2e4);
        local_4d8 = rect2d::size((rect2d *)&storedFbo);
        fVar10 = rect2d::width((rect2d *)local_2e4);
        vec2::vec2(&local_4e0,1.0 / fVar10,0.0);
        drawBlurQuad(this,iVar5 + 4,(GLuint)fVar9,uVar6,local_4d0,local_4d8,local_4e0);
        TexturePool::release(&this->m_texturePool,(GLuint)expandedWidth.br.x);
      }
    }
    glBindFramebuffer(0x8d40,this->m_fbo);
    glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,0);
    glBindFramebuffer(0x8d40,GVar3);
    glDeleteFramebuffers(1,&this->m_fbo);
    this->m_fbo = GVar3;
    this->field_0x1f8 = this->field_0x1f8 & 0xfe | bVar1 & 1;
    this->field_0x1f8 = this->field_0x1f8 & 0xfd | (bVar2 >> 1 & 1) << 1;
    memcpy(&this->m_proj,&storedSize,0x44);
    this->m_matrixState = 0xffffffff;
    this->m_surfaceSize = stack0xffffffffffffff84;
  }
  return;
}

Assistant:

inline void OpenGLRenderer::renderToLayer(Element *e)
{
    // string space;
    // for (int i=0; i<recursion; ++i)
    //     space += "    ";
    // std::cout << space << "- doing layered rendering for: element=" << e << " node=" << e->node << std::endl;
    assert(e->layered);

    // Create the FBO
    rect2d devRect = boundingRectFor(e->vboOffset);

    // Abort the render to layer pass if the dev rect happens to be zero..
    if (devRect.width() <= 0 || devRect.height() <= 0) {
        return;
    }

    // Store current state...
    bool stored3d = m_render3d;
    bool storedTextureed = m_layered;
    GLuint storedFbo = m_fbo;
    mat4 storedProjection = m_proj;
    vec2 storedSize = m_surfaceSize;

    m_render3d |= e->projection;
    m_layered = true;


    BlurNode *blurNode = BlurNode::from(e->node);
    ShadowNode *shadowNode = ShadowNode::from(e->node);

    if (blurNode || shadowNode) {
        devRect.tl -= 1.0f;
        devRect.br += 1.0f;
    }

    // std::cout << space << " ---> from " << e->vboOffset << " " << m_vertices[e->vboOffset] << " " << m_vertices[e->vboOffset+3] << std::endl;

    m_surfaceSize = devRect.size();

    e->texture = m_texturePool.acquire();
    rengine_create_texture(e->texture, devRect.width(), devRect.height());

    glGenFramebuffers(1, &m_fbo);
    glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, e->texture, 0);

#ifndef NDEBUG
    // Only enabled in debug mode because it syncs the GL stack and takes forever..
    if (glCheckFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) {
        logw << "FBO failed, devRect=" << devRect
             << ", dim=" << devRect.width() << "x" << devRect.height() << ", tex=" << e->texture << ", fbo=" << m_fbo << ", error="
             << std::hex << glCheckFramebufferStatus(GL_FRAMEBUFFER) << std::endl;
        assert(false);
    }
#endif

    // Render the layered group
    m_proj = mat4::scale2D(1.0, -1.0)
             * mat4::translate2D(-1.0, 1.0)
             * mat4::scale2D(2.0f / devRect.width(), -2.0f / devRect.height())
             * mat4::translate2D(-devRect.tl.x, -devRect.tl.y);
    m_matrixState = UpdateAllPrograms;

    // std::cout << " ---> rect=" << devRect << " texture=" << e->texture << " fbo=" << m_fbo
    //           << " status=" << hex << glCheckFramebufferStatus(GL_FRAMEBUFFER) << " ok=" << GL_FRAMEBUFFER_COMPLETE
    //           << " " << m_proj << std::endl;

    glClearColor(0, 0, 0, 0);
    glClear(GL_COLOR_BUFFER_BIT);
    render(e + 1, e + e->groupSize + 1);

    if (blurNode || shadowNode) {
        int tmpTex = e->texture;
        e->texture = m_texturePool.acquire();
        rect2d expandedWidth = boundingRectFor(e->vboOffset + 4);
        m_proj = mat4::scale2D(1.0, -1.0)
                 * mat4::translate2D(-1.0, 1.0)
                 * mat4::scale2D(2.0f / expandedWidth.width(), -2.0f / expandedWidth.height())
                 * mat4::translate2D(-expandedWidth.tl.x, -expandedWidth.tl.y);
        m_matrixState = UpdateAllPrograms;
        rengine_create_texture(e->texture, expandedWidth.width(), expandedWidth.height());
        glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, e->texture, 0);
        glClear(GL_COLOR_BUFFER_BIT);
        glViewport(0, 0, expandedWidth.width(), expandedWidth.height());
        if (blurNode) {
            drawBlurQuad(e->vboOffset + 4, tmpTex, blurNode->radius(), expandedWidth.size(), devRect.size(), vec2(1/expandedWidth.width(), 0));
            m_texturePool.release(tmpTex);
        } else if (shadowNode) {
            drawShadowQuad(e->vboOffset + 4, tmpTex, shadowNode->radius(), expandedWidth.size(), devRect.size(), vec2(1/expandedWidth.width(), 0), vec4(0, 0, 0, 1));
            e->sourceTexture = tmpTex;
        }
    }

    // Reset the GL state..
    glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
    glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
    glBindFramebuffer(GL_FRAMEBUFFER, storedFbo);
    glDeleteFramebuffers(1, &m_fbo);

    // Reset the old state...
    m_fbo = storedFbo;
    m_render3d = stored3d;
    m_layered = storedTextureed;
    m_proj = storedProjection;
    m_matrixState = UpdateAllPrograms;
    m_surfaceSize = storedSize;

    // std::cout << space << "- layer is completed..." << std::endl;
}